

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpFloatNan::TypeOpFloatNan(TypeOpFloatNan *this,TypeFactory *t,Translate *trans)

{
  OpBehavior *pOVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"NAN",&local_39);
  TypeOpFunc::TypeOpFunc(&this->super_TypeOpFunc,t,CPUI_FLOAT_NAN,&local_38,TYPE_BOOL,TYPE_FLOAT);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f4358;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48080;
  pOVar1 = (OpBehavior *)operator_new(0x18);
  pOVar1->opcode = CPUI_FLOAT_NAN;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fecf8;
  pOVar1[1]._vptr_OpBehavior = (_func_int **)trans;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpFloatNan::TypeOpFloatNan(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_NAN,"NAN",TYPE_BOOL,TYPE_FLOAT)
{
  opflags = PcodeOp::unary | PcodeOp::booloutput | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatNan(trans);
}